

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpdebug.c
# Opt level: O3

void UpnpPrintf(Upnp_LogLevel DLevel,Dbg_Module Module,char *DbgFileName,int DbgLineNo,char *FmtStr,
               ...)

{
  FILE *__stream;
  char in_AL;
  tm *__tp;
  pthread_t pVar1;
  undefined8 in_R9;
  char *pcVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  time_t now;
  va_list ArgList;
  char local_128 [32];
  char timebuf [26];
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((initwascalled == '\x01') && (DLevel <= g_log_level)) {
    local_c0 = in_R9;
    pthread_mutex_lock((pthread_mutex_t *)&GlobalDebugMutex);
    __stream = fp;
    if (fp == (FILE *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)&GlobalDebugMutex);
      return;
    }
    ArgList[0].reg_save_area = local_e8;
    ArgList[0].overflow_arg_area = &stack0x00000008;
    ArgList[0].gp_offset = 0x28;
    ArgList[0].fp_offset = 0x30;
    if (DbgFileName != (char *)0x0) {
      now = time((time_t *)0x0);
      snprintf(local_128,0x19,"%d",(ulong)DLevel);
      if (Module < 8) {
        pcVar2 = &DAT_0012b808 + *(int *)(&DAT_0012b808 + (ulong)Module * 4);
      }
      else {
        pcVar2 = "UNKN";
      }
      __tp = localtime(&now);
      strftime(timebuf,0x1a,"%Y-%m-%d %H:%M:%S",__tp);
      pVar1 = pthread_self();
      fprintf((FILE *)__stream,"%s UPNP-%s-%s: Thread:0x%lX [%s:%d]: ",timebuf,pcVar2,local_128,
              pVar1,DbgFileName,(ulong)(uint)DbgLineNo);
      fflush((FILE *)__stream);
      vfprintf((FILE *)fp,FmtStr,ArgList);
      fflush((FILE *)fp);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&GlobalDebugMutex);
  }
  return;
}

Assistant:

void UpnpPrintf(Upnp_LogLevel DLevel,
	Dbg_Module Module,
	const char *DbgFileName,
	int DbgLineNo,
	const char *FmtStr,
	...)
{
	/*fprintf(stderr, "UpnpPrintf: fp %p level %d glev %d mod %d DEBUG_ALL
	  %d\n", fp, DLevel, g_log_level, Module, DEBUG_ALL);*/
	va_list ArgList;

	if (!initwascalled) {
		return;
	}

	if (!DebugAtThisLevel(DLevel, Module))
		return;
	ithread_mutex_lock(&GlobalDebugMutex);
	if (fp == NULL) {
		ithread_mutex_unlock(&GlobalDebugMutex);
		return;
	}

	va_start(ArgList, FmtStr);
	if (DbgFileName) {
		UpnpDisplayFileAndLine(
			fp, DbgFileName, DbgLineNo, DLevel, Module);
		vfprintf(fp, FmtStr, ArgList);
		fflush(fp);
	}
	va_end(ArgList);
	ithread_mutex_unlock(&GlobalDebugMutex);
}